

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::PowModBarrett(BN *__return_storage_ptr__,BN *this,BN *power,BN *mod)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ushort uVar6;
  pointer puVar7;
  BN t;
  BN mu;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  puVar7 = (power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((ulong)((long)(power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) < 3) &&
     (*puVar7 == 0)) {
    bn1();
  }
  else {
    anon_unknown.dwarf_c68a::reductionBarrettPrecomputation(&mu,mod);
    bn1();
    operator%(&t,this,mod);
    sVar3 = bitCount(power);
    iVar5 = 0;
    iVar2 = (int)sVar3;
    iVar4 = 0;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    puVar7 = (power->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar1 = 1;
    for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
      uVar6 = 1;
      if (1 < uVar1) {
        uVar6 = uVar1;
      }
      if ((puVar7[uVar1 == 0] & uVar6) != 0) {
        karatsubaMultiplication((BN *)&local_60,__return_storage_ptr__,&t);
        reductionBarrett((BN *)&local_48,(BN *)&local_60,mod,&mu);
        operator=(__return_storage_ptr__,(BN *)&local_48);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
      }
      if (iVar2 + -1 != iVar5) {
        Qrt((BN *)&local_60,&t);
        reductionBarrett((BN *)&local_48,(BN *)&local_60,mod,&mu);
        operator=(&t,(BN *)&local_48);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
      }
      puVar7 = puVar7 + (uVar1 == 0);
      uVar1 = uVar6 * 2;
    }
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&t);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&mu);
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::PowModBarrett(const BN& power, const BN& mod) const {
    if(power.is0())
        return BN::bn1();

    BN mu = reductionBarrettPrecomputation(mod);
    BN res(BN::bn1());
    BN t = (*this) % mod;

    int len = power.bitCount();
    bt mask = 1;
    const bt *curr = &*power.ba.begin();
    for(int i = 0; i < len; i++) {
        if(!mask) {
            mask = 1;
            ++curr;
        }
        if( (*curr) & mask)
            res = (res*t).reductionBarrett(mod, mu);

        if (i + 1 != len)
            t = t.Qrt().reductionBarrett(mod, mu);
        mask <<= 1;
    }
    return res;
}